

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

motion_state_ptr __thiscall APhyBullet::BulletEngine::createDefaultMotionState(BulletEngine *this)

{
  _func_int **pp_Var1;
  btMotionState *handle;
  btTransform *pbVar2;
  btTransform *pbVar3;
  BulletMotionState *this_00;
  motion_state_ptr prVar4;
  
  handle = (btMotionState *)btAlignedAllocInternal(0xd0,0x10);
  pbVar2 = btTransform::getIdentity();
  pbVar3 = btTransform::getIdentity();
  handle->_vptr_btMotionState = (_func_int **)&PTR__btMotionState_0021a920;
  pp_Var1 = *(_func_int ***)((pbVar2->m_basis).m_el[0].m_floats + 2);
  handle[1]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_basis).m_el[0].m_floats;
  handle[2]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar2->m_basis).m_el[1].m_floats + 2);
  handle[3]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_basis).m_el[1].m_floats;
  handle[4]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar2->m_basis).m_el[2].m_floats + 2);
  handle[5]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_basis).m_el[2].m_floats;
  handle[6]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar2->m_origin).m_floats + 2);
  handle[7]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_origin).m_floats;
  handle[8]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar3->m_basis).m_el[0].m_floats + 2);
  handle[9]._vptr_btMotionState = *(_func_int ***)(pbVar3->m_basis).m_el[0].m_floats;
  handle[10]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar3->m_basis).m_el[1].m_floats + 2);
  handle[0xb]._vptr_btMotionState = *(_func_int ***)(pbVar3->m_basis).m_el[1].m_floats;
  handle[0xc]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar3->m_basis).m_el[2].m_floats + 2);
  handle[0xd]._vptr_btMotionState = *(_func_int ***)(pbVar3->m_basis).m_el[2].m_floats;
  handle[0xe]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar3->m_origin).m_floats + 2);
  handle[0xf]._vptr_btMotionState = *(_func_int ***)(pbVar3->m_origin).m_floats;
  handle[0x10]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar2->m_basis).m_el[0].m_floats + 2);
  handle[0x11]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_basis).m_el[0].m_floats;
  handle[0x12]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar2->m_basis).m_el[1].m_floats + 2);
  handle[0x13]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_basis).m_el[1].m_floats;
  handle[0x14]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar2->m_basis).m_el[2].m_floats + 2);
  handle[0x15]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_basis).m_el[2].m_floats;
  handle[0x16]._vptr_btMotionState = pp_Var1;
  pp_Var1 = *(_func_int ***)((pbVar2->m_origin).m_floats + 2);
  handle[0x17]._vptr_btMotionState = *(_func_int ***)(pbVar2->m_origin).m_floats;
  handle[0x18]._vptr_btMotionState = pp_Var1;
  handle[0x19]._vptr_btMotionState = (_func_int **)0x0;
  this_00 = (BulletMotionState *)operator_new(0x18);
  BulletMotionState::BulletMotionState(this_00,handle);
  prVar4 = (motion_state_ptr)operator_new(0x18);
  prVar4->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar4->object = (motion_state *)this_00;
  prVar4->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar4->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_00->super_motion_state).super_base_interface.myRefCounter = prVar4;
  return prVar4;
}

Assistant:

APHY_EXPORT aphy_error aphyGetEngines ( aphy_size numengines, aphy_engine** engines, aphy_size* ret_numengines )
{
    using namespace aphy;
    using namespace APhyBullet;

    if(ret_numengines)
        *ret_numengines = 1;

    if(engines && numengines >= 1)
        engines[0] = reinterpret_cast<aphy_engine* > (makeObject<BulletEngine> ().disown());

    return APHY_OK;
}